

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::WritePerSampleExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
          *items,int eptype,int eptype_tvar)

{
  pointer *ppTVar1;
  OASIS_FLOAT current_loss;
  iterator __position;
  long lVar2;
  double current_return_period;
  pointer pfVar3;
  ulong uVar4;
  mapped_type *this_00;
  code *pcVar5;
  _Base_ptr p_Var6;
  long *plVar7;
  pointer pfVar8;
  int counter;
  _Rb_tree_header *p_Var9;
  size_t nextreturnperiodindex;
  OASIS_FLOAT last_computed_loss;
  double last_computed_rp;
  pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> s;
  map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  float local_d8;
  OASIS_FLOAT *local_d0;
  undefined1 local_c8 [16];
  OASIS_FLOAT *local_b8;
  OASIS_FLOAT *local_b0;
  double local_a8;
  int local_9c;
  key_type local_98;
  vector<float,_std::allocator<float>_> local_90;
  OASIS_FLOAT *local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  local_60;
  
  if ((items->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var6 = (items->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &(items->_M_t)._M_impl.super__Rb_tree_header;
    local_9c = eptype_tvar;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var6 != p_Var9) {
      local_a8 = (double)this->totalperiods_;
      local_70 = &p_Var9->_M_header;
      do {
        local_98.summary_id = p_Var6[1]._M_color;
        local_98.sidx = *(int *)&p_Var6[1].field_0x4;
        local_68 = p_Var6;
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_90,(vector<float,_std::allocator<float>_> *)&p_Var6[1]._M_parent);
        pfVar8 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pfVar3 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          local_c8._0_8_ =
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_d0 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
          uVar4 = (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
          lVar2 = 0x3f;
          if (uVar4 != 0) {
            for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          std::
          __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_c8,&local_d0,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
          local_b0 = pfVar8;
          local_b8 = pfVar3;
          std::
          __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (&local_b0,&local_b8);
        }
        pfVar3 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_d0 = (OASIS_FLOAT *)0x0;
        local_b0 = (OASIS_FLOAT *)0x0;
        local_b8 = (OASIS_FLOAT *)((ulong)local_b8 & 0xffffffff00000000);
        if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          counter = 1;
          local_d8 = 0.0;
        }
        else {
          local_d8 = 0.0;
          counter = 1;
          pfVar8 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            current_loss = *pfVar8;
            if (this->useReturnPeriodFile_ == true) {
              local_c8._0_8_ = this->WritePSEPTOutput;
              local_c8._8_8_ = *(undefined8 *)&this->field_0x168;
              WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                        (this,fileIDs,(size_t *)&local_d0,(double *)&local_b0,
                         (OASIS_FLOAT *)&local_b8,local_a8 / (double)counter,current_loss,
                         local_98.summary_id,eptype,local_98.sidx,local_a8,counter,local_d8,
                         (map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                          *)&local_60,local_c8._0_8_,
                         (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                          *)local_c8._8_8_);
              local_d8 = local_d8 - (local_d8 - current_loss) / (float)counter;
            }
            else {
              local_78 = (OASIS_FLOAT *)(local_a8 / (double)counter);
              this_00 = std::
                        map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                        ::operator[]((map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                                      *)&local_60,&local_98);
              local_d8 = local_d8 - (local_d8 - current_loss) / (float)counter;
              local_c8._0_8_ = local_78;
              local_c8._8_4_ = local_d8;
              __position._M_current =
                   (this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<TVaR,_std::allocator<TVaR>_>::_M_realloc_insert<TVaR>
                          (this_00,__position,(TVaR *)local_c8);
              }
              else {
                (__position._M_current)->retperiod = (double)local_78;
                *(undefined8 *)&(__position._M_current)->tvar = local_c8._8_8_;
                ppTVar1 = &(this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppTVar1 = *ppTVar1 + 1;
              }
              pcVar5 = (code *)this->WritePSEPTOutput;
              if (pcVar5 != (code *)0x0) {
                plVar7 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x168);
                if (((ulong)pcVar5 & 1) != 0) {
                  pcVar5 = *(code **)(pcVar5 + *plVar7 + -1);
                }
                (*pcVar5)((int)local_78,current_loss,plVar7,fileIDs,(ulong)local_98 & 0xffffffff,
                          local_98.sidx,eptype);
              }
            }
            counter = counter + 1;
            pfVar8 = pfVar8 + 1;
          } while (pfVar8 != pfVar3);
        }
        if (this->useReturnPeriodFile_ == true) {
          do {
            current_return_period = 0.0;
            if (0 < (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)local_d0]) {
              current_return_period = local_a8 / (double)counter;
            }
            local_c8._0_8_ = this->WritePSEPTOutput;
            local_c8._8_8_ = *(undefined8 *)&this->field_0x168;
            WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                      (this,fileIDs,(size_t *)&local_d0,(double *)&local_b0,(OASIS_FLOAT *)&local_b8
                       ,current_return_period,0.0,local_98.summary_id,eptype,local_98.sidx,local_a8,
                       counter,local_d8,
                       (map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                        *)&local_60,local_c8._0_8_,
                       (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                        *)local_c8._8_8_);
            local_d8 = local_d8 - local_d8 / (float)counter;
            counter = counter + 1;
          } while (local_d0 <
                   (OASIS_FLOAT *)
                   ((long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (OASIS_FLOAT *)0x0) {
          operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_68);
      } while (p_Var6 != local_70);
    }
    if ((this->ordFlag_ != false) && (this->fout_[1] != (FILE *)0x0)) {
      WriteTVaR(this,fileIDs,local_9c,
                (map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                 *)&local_60);
    }
    std::
    _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void aggreports::WritePerSampleExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<wheatkey, lossvec> &items,
	int eptype, int eptype_tvar) {

  if (items.size() == 0) return;

#ifdef ORD_OUTPUT
  if (os_psept_exists_ == false) {
  	if (parquetFileNames_[PSEPT] != "") {
		os_psept_ = GetParquetStreamWriter(PSEPT);
		os_psept_exists_ = true;
	}
  }
#endif

  std::map<wheatkey, std::vector<TVaR>> tail;
  const double max_retperiod = totalperiods_;

  for (auto s : items) {
    lossvec &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    int i = 1;

    for (auto lp : lpv) {
      double retperiod = max_retperiod / i;

      if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     os_psept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput);
#endif
	tvar = tvar - ((tvar - lp) / i);
      } else {
	tvar = tvar - ((tvar - lp) / i);
	tail[s.first].push_back({retperiod, tvar});
	if (WritePSEPTOutput != nullptr) {
	  (this->*WritePSEPTOutput)(fileIDs, s.first.summary_id, s.first.sidx,
				    eptype, retperiod, lp);
	}
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	if (parquetFileNames_[PSEPT] != "") {
	  WriteParquetOutput(os_psept_, s.first.summary_id, s.first.sidx,
			     eptype, retperiod, lp);
	}
#endif
      }
      i++;
    }
    if (useReturnPeriodFile_) {
      do {
	double retperiod = max_retperiod / i;
	if (returnperiods_[nextreturnperiodindex] <= 0) retperiod = 0;
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     os_psept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[PSEPT] != nullptr) WriteTVaR(fileIDs, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[PSEPT] != "") WriteTVaR(os_psept_, eptype_tvar, tail);
#endif

}